

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<std::complex<double>,_10>::Resize
          (TPZManVector<std::complex<double>,_10> *this,int64_t newsize,complex<double> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  complex<double> *pcVar4;
  complex<double> *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar7 = (this->super_TPZVec<std::complex<double>_>).fNElements;
  if (newsize != lVar7) {
    lVar8 = (this->super_TPZVec<std::complex<double>_>).fNAlloc;
    if (lVar8 < newsize) {
      if ((ulong)newsize < 0xb) {
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        else {
          pcVar4 = (this->super_TPZVec<std::complex<double>_>).fStore;
          lVar6 = 0;
          lVar8 = lVar7;
          do {
            puVar1 = (undefined8 *)(pcVar4->_M_value + lVar6);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)(this->fExtAlloc[0]._M_value + lVar6);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            lVar6 = lVar6 + 0x10;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        lVar8 = newsize - lVar7;
        if (lVar8 != 0 && lVar7 <= newsize) {
          pcVar4 = this->fExtAlloc + lVar7;
          do {
            uVar3 = *(undefined8 *)(object->_M_value + 8);
            *(undefined8 *)pcVar4->_M_value = *(undefined8 *)object->_M_value;
            *(undefined8 *)(pcVar4->_M_value + 8) = uVar3;
            pcVar4 = pcVar4 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        pcVar4 = (this->super_TPZVec<std::complex<double>_>).fStore;
        if (pcVar4 != (complex<double> *)0x0 && pcVar4 != this->fExtAlloc) {
          operator_delete__(pcVar4);
        }
        (this->super_TPZVec<std::complex<double>_>).fStore = this->fExtAlloc;
        (this->super_TPZVec<std::complex<double>_>).fNElements = newsize;
        (this->super_TPZVec<std::complex<double>_>).fNAlloc = 10;
      }
      else {
        dVar10 = (double)lVar8 * 1.2;
        uVar9 = (long)dVar10;
        if (dVar10 < (double)newsize) {
          uVar9 = newsize;
        }
        pcVar4 = (complex<double> *)operator_new__(-(ulong)(uVar9 >> 0x3c != 0) | uVar9 << 4);
        if (uVar9 != 0) {
          memset(pcVar4,0,uVar9 << 4);
        }
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        else {
          pcVar5 = (this->super_TPZVec<std::complex<double>_>).fStore;
          lVar6 = 0;
          lVar8 = lVar7;
          do {
            puVar1 = (undefined8 *)(pcVar5->_M_value + lVar6);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)((long)pcVar4->_M_value + lVar6);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            lVar6 = lVar6 + 0x10;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        lVar8 = newsize - lVar7;
        if (lVar8 != 0 && lVar7 <= newsize) {
          pcVar5 = pcVar4 + lVar7;
          do {
            uVar3 = *(undefined8 *)(object->_M_value + 8);
            *(undefined8 *)pcVar5->_M_value = *(undefined8 *)object->_M_value;
            *(undefined8 *)((long)pcVar5->_M_value + 8) = uVar3;
            pcVar5 = pcVar5 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        pcVar5 = (this->super_TPZVec<std::complex<double>_>).fStore;
        if (pcVar5 != (complex<double> *)0x0 && pcVar5 != this->fExtAlloc) {
          operator_delete__(pcVar5);
        }
        (this->super_TPZVec<std::complex<double>_>).fStore = pcVar4;
        (this->super_TPZVec<std::complex<double>_>).fNElements = newsize;
        (this->super_TPZVec<std::complex<double>_>).fNAlloc = uVar9;
      }
    }
    else {
      lVar8 = newsize - lVar7;
      if (lVar8 != 0 && lVar7 <= newsize) {
        lVar7 = lVar7 << 4;
        do {
          uVar3 = *(undefined8 *)(object->_M_value + 8);
          puVar1 = (undefined8 *)
                   (((this->super_TPZVec<std::complex<double>_>).fStore)->_M_value + lVar7);
          *puVar1 = *(undefined8 *)object->_M_value;
          puVar1[1] = uVar3;
          lVar7 = lVar7 + 0x10;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      (this->super_TPZVec<std::complex<double>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}